

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O0

void __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::MutObjective::set_type(MutObjective *this,Type type)

{
  int in_ESI;
  size_type in_RDI;
  vector<bool,_std::allocator<bool>_> *unaff_retaddr;
  reference local_20;
  
  local_20 = std::vector<bool,_std::allocator<bool>_>::operator[](unaff_retaddr,in_RDI);
  std::_Bit_reference::operator=(&local_20,in_ESI == 1);
  return;
}

Assistant:

void set_type(obj::Type type) const {
      this->problem_->is_obj_max_[this->index_] = (type == obj::MAX);
    }